

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O3

void __thiscall
SimpleWeb::
ServerBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
::write_response_impl<std::function<void(std::ostream&,std::shared_ptr<SimpleWeb::Request>)>>
          (ServerBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
           *this,shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                 *socket,shared_ptr<SimpleWeb::Request> *request,
          function<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_std::shared_ptr<SimpleWeb::Request>)>
          *function)

{
  range_error *this_00;
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_> write_buffer;
  ostream response;
  transfer_all_t local_1d9;
  basic_streambuf<std::allocator<char>_> *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1d0;
  element_type *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  shared_ptr<SimpleWeb::Request> local_1b8;
  undefined1 local_1a8 [8];
  element_type *peStack_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  element_type *local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_188;
  basic_streambuf<std::allocator<char>_> *local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_178;
  __shared_ptr<boost::asio::basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_170;
  __shared_ptr<boost::asio::basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_158;
  basic_streambuf_ref<std::allocator<char>_> local_148;
  element_type *local_140;
  basic_ostream<char,_std::char_traits<char>_> local_138 [8];
  ios_base local_130 [264];
  
  local_1d8 = (basic_streambuf<std::allocator<char>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<boost::asio::basic_streambuf<std::allocator<char>>,std::allocator<boost::asio::basic_streambuf<std::allocator<char>>>>
            (&_Stack_1d0,&local_1d8,
             (allocator<boost::asio::basic_streambuf<std::allocator<char>_>_> *)local_138);
  std::ostream::ostream(local_138,&local_1d8->super_streambuf);
  local_1b8.super___shared_ptr<SimpleWeb::Request,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (request->super___shared_ptr<SimpleWeb::Request,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1b8.super___shared_ptr<SimpleWeb::Request,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (request->super___shared_ptr<SimpleWeb::Request,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  p_Var2 = (request->super___shared_ptr<SimpleWeb::Request,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  if ((function->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*function->_M_invoker)((_Any_data *)function,local_138,&local_1b8);
    if (local_1b8.super___shared_ptr<SimpleWeb::Request,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.super___shared_ptr<SimpleWeb::Request,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar1 = *(long *)(this + 0x140);
    local_140 = (socket->
                super___shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
    if (lVar1 == 0) {
      local_158._M_ptr = (element_type *)0x0;
      local_158._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_1c0 = (socket->
                  super___shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount._M_pi;
      if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
          UNLOCK();
          lVar1 = *(long *)(this + 0x140);
        }
        else {
          local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
        }
      }
      local_1c8 = local_140;
      if (lVar1 < 0) goto LAB_001631b8;
      ServerBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
      ::set_timeout_on_socket
                ((ServerBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                  *)local_1a8,
                 (shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                  *)this,(long)&local_1c8);
      local_158._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_1a0;
      local_158._M_ptr = (element_type *)local_1a8;
      local_1a8 = (undefined1  [8])0x0;
      peStack_1a0 = (element_type *)0x0;
      if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0);
      }
      local_140 = (socket->
                  super___shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
    }
    local_198._M_pi =
         (socket->
         super___shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
         )._M_refcount._M_pi;
    if (local_198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_198._M_pi)->_M_use_count = (local_198._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_198._M_pi)->_M_use_count = (local_198._M_pi)->_M_use_count + 1;
      }
    }
    local_190 = (request->super___shared_ptr<SimpleWeb::Request,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    _Stack_188._M_pi =
         (request->super___shared_ptr<SimpleWeb::Request,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    p_Var2 = (request->super___shared_ptr<SimpleWeb::Request,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    local_180 = local_1d8;
    _Stack_178._M_pi = _Stack_1d0._M_pi;
    if (_Stack_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_1d0._M_pi)->_M_use_count = (_Stack_1d0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_1d0._M_pi)->_M_use_count = (_Stack_1d0._M_pi)->_M_use_count + 1;
      }
    }
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             vpextrq_avx((undefined1  [16])local_158,1);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    local_148.sb_ = local_1d8;
    local_1a8 = (undefined1  [8])this;
    peStack_1a0 = local_140;
    local_170 = local_158;
    boost::asio::detail::
    initiate_async_write_dynbuf_v1<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
    ::operator()((initiate_async_write_dynbuf_v1<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                  *)&local_140,(anon_class_72_5_e6c1649b_for_handler_ *)local_1a8,&local_148,
                 &local_1d9);
    if ((pointer)local_170._M_refcount._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_refcount._M_pi);
    }
    if (_Stack_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_178._M_pi);
    }
    if ((_Base_ptr)_Stack_188._M_pi != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_188._M_pi);
    }
    if (local_198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198._M_pi);
    }
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    std::ios_base::~ios_base(local_130);
    if (_Stack_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1d0._M_pi);
    }
    return;
  }
  std::__throw_bad_function_call();
LAB_001631b8:
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"failed to convert size_t to long");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

void write_response_impl(std::shared_ptr<socket_type> socket, 
			std::shared_ptr<Request> request, Func& function) 
		{
        	auto write_buffer(std::make_shared<boost::asio::streambuf>());
        	std::ostream response(write_buffer.get());
        	//res_it->second.functions[static_cast<size_t>(type)](response, request);
        	//functions[static_cast<size_t>(type)](response, request);
        	function(response, request);

        	//Set timeout on the following boost::asio::async-read or write function
        	std::shared_ptr<boost::asio::deadline_timer> timer;
        	if(timeout_content > 0u)
        	    timer = set_timeout_on_socket(socket, 
					safeSizetToLong(timeout_content));
        	
        	//Capture write_buffer in lambda so it is not destroyed before async_write is finished
        	boost::asio::async_write(*socket, *write_buffer, 
                [this, socket, request, write_buffer, timer]
                (const boost::system::error_code& ec, 
				 size_t /*bytes_transferredLocal*/) 
			{
        	    if(timeout_content > 0) {
        	        timer->cancel();
				}
        	    //HTTP persistent connection (HTTP 1.1):
        	    if(!ec && stof(request->http_version) > 1.05) {
        	        read_request_and_content(socket);
				}
        	});
		}